

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  Geometry *this;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar33;
  bool bVar34;
  long lVar35;
  byte bVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  ulong uVar38;
  byte bVar39;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar40;
  uint uVar41;
  size_t sVar42;
  size_t i;
  bool bVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  long lStack_24e0;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar59 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    auVar58 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar59 = ZEXT1664(auVar58);
  }
  pSVar40 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar56._4_4_ = fVar1;
  auVar56._0_4_ = fVar1;
  auVar56._8_4_ = fVar1;
  auVar56._12_4_ = fVar1;
  auVar56._16_4_ = fVar1;
  auVar56._20_4_ = fVar1;
  auVar56._24_4_ = fVar1;
  auVar56._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar57._4_4_ = fVar2;
  auVar57._0_4_ = fVar2;
  auVar57._8_4_ = fVar2;
  auVar57._12_4_ = fVar2;
  auVar57._16_4_ = fVar2;
  auVar57._20_4_ = fVar2;
  auVar57._24_4_ = fVar2;
  auVar57._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar60._4_4_ = fVar3;
  auVar60._0_4_ = fVar3;
  auVar60._8_4_ = fVar3;
  auVar60._12_4_ = fVar3;
  auVar60._16_4_ = fVar3;
  auVar60._20_4_ = fVar3;
  auVar60._24_4_ = fVar3;
  auVar60._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar52._4_4_ = uVar4;
  auVar52._0_4_ = uVar4;
  auVar52._8_4_ = uVar4;
  auVar52._12_4_ = uVar4;
  auVar52._16_4_ = uVar4;
  auVar52._20_4_ = uVar4;
  auVar52._24_4_ = uVar4;
  auVar52._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar54._4_4_ = uVar4;
  auVar54._0_4_ = uVar4;
  auVar54._8_4_ = uVar4;
  auVar54._12_4_ = uVar4;
  auVar54._16_4_ = uVar4;
  auVar54._20_4_ = uVar4;
  auVar54._24_4_ = uVar4;
  auVar54._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar45._4_4_ = uVar4;
  auVar45._0_4_ = uVar4;
  auVar45._8_4_ = uVar4;
  auVar45._12_4_ = uVar4;
  auVar45._16_4_ = uVar4;
  auVar45._20_4_ = uVar4;
  auVar45._24_4_ = uVar4;
  auVar45._28_4_ = uVar4;
  bVar34 = false;
  auVar17 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar61 = ZEXT3264(auVar17);
  auVar62 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar17 = vsubps_avx(auVar56,auVar52);
    auVar13 = vsubps_avx(auVar57,auVar54);
    auVar14 = vsubps_avx(auVar60,auVar45);
    auVar55._0_4_ = fVar3 + auVar45._0_4_;
    auVar55._4_4_ = fVar3 + auVar45._4_4_;
    auVar55._8_4_ = fVar3 + auVar45._8_4_;
    auVar55._12_4_ = fVar3 + auVar45._12_4_;
    auVar55._16_4_ = fVar3 + auVar45._16_4_;
    auVar55._20_4_ = fVar3 + auVar45._20_4_;
    auVar55._24_4_ = fVar3 + auVar45._24_4_;
    auVar55._28_4_ = fVar3 + auVar45._28_4_;
    auVar45 = vmulps_avx512vl(auVar52,auVar52);
    auVar58 = auVar59._0_16_;
LAB_01c7bed3:
    do {
      if (pSVar40 == stack) {
        return bVar34;
      }
      pSVar33 = pSVar40 + -1;
      pSVar40 = pSVar40 + -1;
    } while (auVar59._0_4_ < (float)pSVar33->dist);
    sVar42 = (pSVar40->ptr).ptr;
LAB_01c7beef:
    while (uVar41 = (uint)sVar42, context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar42 & 8) != 0) goto LAB_01c7c3fb;
      uVar38 = sVar42 & 0xfffffffffffffff0;
      fVar5 = query->time;
      auVar49._4_4_ = fVar5;
      auVar49._0_4_ = fVar5;
      auVar49._8_4_ = fVar5;
      auVar49._12_4_ = fVar5;
      auVar49._16_4_ = fVar5;
      auVar49._20_4_ = fVar5;
      auVar49._24_4_ = fVar5;
      auVar49._28_4_ = fVar5;
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100),auVar49,
                                *(undefined1 (*) [32])(uVar38 + 0x40));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x140),auVar49,
                                *(undefined1 (*) [32])(uVar38 + 0x80));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x180),auVar49,
                                *(undefined1 (*) [32])(uVar38 + 0xc0));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x120),auVar49,
                                *(undefined1 (*) [32])(uVar38 + 0x60));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x160),auVar49,
                                *(undefined1 (*) [32])(uVar38 + 0xa0));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x1a0),auVar49,
                                *(undefined1 (*) [32])(uVar38 + 0xe0));
      auVar48 = vmaxps_avx(auVar56,ZEXT1632(auVar27));
      auVar48 = vminps_avx(auVar48,ZEXT1632(auVar30));
      auVar15 = vsubps_avx(auVar48,auVar56);
      auVar48 = vmaxps_avx(auVar57,ZEXT1632(auVar28));
      auVar48 = vminps_avx(auVar48,ZEXT1632(auVar31));
      auVar46 = vsubps_avx(auVar48,auVar57);
      auVar48 = vmaxps_avx(auVar60,ZEXT1632(auVar29));
      auVar48 = vminps_avx(auVar48,ZEXT1632(auVar32));
      auVar48 = vsubps_avx(auVar48,auVar60);
      auVar53._0_4_ =
           auVar48._0_4_ * auVar48._0_4_ +
           auVar46._0_4_ * auVar46._0_4_ + auVar15._0_4_ * auVar15._0_4_;
      auVar53._4_4_ =
           auVar48._4_4_ * auVar48._4_4_ +
           auVar46._4_4_ * auVar46._4_4_ + auVar15._4_4_ * auVar15._4_4_;
      auVar53._8_4_ =
           auVar48._8_4_ * auVar48._8_4_ +
           auVar46._8_4_ * auVar46._8_4_ + auVar15._8_4_ * auVar15._8_4_;
      auVar53._12_4_ =
           auVar48._12_4_ * auVar48._12_4_ +
           auVar46._12_4_ * auVar46._12_4_ + auVar15._12_4_ * auVar15._12_4_;
      auVar53._16_4_ =
           auVar48._16_4_ * auVar48._16_4_ +
           auVar46._16_4_ * auVar46._16_4_ + auVar15._16_4_ * auVar15._16_4_;
      auVar53._20_4_ =
           auVar48._20_4_ * auVar48._20_4_ +
           auVar46._20_4_ * auVar46._20_4_ + auVar15._20_4_ * auVar15._20_4_;
      auVar53._24_4_ =
           auVar48._24_4_ * auVar48._24_4_ +
           auVar46._24_4_ * auVar46._24_4_ + auVar15._24_4_ * auVar15._24_4_;
      auVar53._28_4_ = auVar46._28_4_ + auVar46._28_4_ + auVar15._28_4_;
      uVar25 = vcmpps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar30),2);
      uVar24 = vcmpps_avx512vl(ZEXT1632(auVar30),auVar17,1);
      auVar15._4_4_ = fVar1 + auVar52._4_4_;
      auVar15._0_4_ = fVar1 + auVar52._0_4_;
      auVar15._8_4_ = fVar1 + auVar52._8_4_;
      auVar15._12_4_ = fVar1 + auVar52._12_4_;
      auVar15._16_4_ = fVar1 + auVar52._16_4_;
      auVar15._20_4_ = fVar1 + auVar52._20_4_;
      auVar15._24_4_ = fVar1 + auVar52._24_4_;
      auVar15._28_4_ = fVar1 + auVar52._28_4_;
      uVar19 = vcmpps_avx512vl(ZEXT1632(auVar27),auVar15,6);
      uVar20 = vcmpps_avx512vl(ZEXT1632(auVar31),auVar13,1);
      auVar48._4_4_ = fVar2 + auVar54._4_4_;
      auVar48._0_4_ = fVar2 + auVar54._0_4_;
      auVar48._8_4_ = fVar2 + auVar54._8_4_;
      auVar48._12_4_ = fVar2 + auVar54._12_4_;
      auVar48._16_4_ = fVar2 + auVar54._16_4_;
      auVar48._20_4_ = fVar2 + auVar54._20_4_;
      auVar48._24_4_ = fVar2 + auVar54._24_4_;
      auVar48._28_4_ = fVar2 + auVar54._28_4_;
      uVar21 = vcmpps_avx512vl(ZEXT1632(auVar28),auVar48,6);
      uVar22 = vcmpps_avx512vl(ZEXT1632(auVar32),auVar14,1);
      uVar23 = vcmpps_avx512vl(ZEXT1632(auVar29),auVar55,6);
      bVar39 = ~((byte)uVar21 | (byte)uVar19 | (byte)uVar23 | (byte)uVar24 |
                (byte)uVar20 | (byte)uVar22) & (byte)uVar25;
      uVar44 = (ulong)bVar39;
      if ((uVar41 & 7) == 6) {
        uVar25 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [32])(uVar38 + 0x1e0),1);
        uVar24 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [32])(uVar38 + 0x1c0),0xd);
        uVar44 = (ulong)(bVar39 & (byte)uVar25 & (byte)uVar24);
      }
LAB_01c7bfce:
      bVar39 = (byte)uVar44;
      if (bVar39 == 0) goto LAB_01c7bed3;
      auVar48 = *(undefined1 (*) [32])(sVar42 & 0xfffffffffffffff0);
      auVar15 = ((undefined1 (*) [32])(sVar42 & 0xfffffffffffffff0))[1];
      auVar46 = vpternlogd_avx512vl(auVar61._0_32_,auVar53,auVar62._0_32_,0xf8);
      auVar47 = vpcompressd_avx512vl(auVar46);
      auVar51._0_4_ = (uint)(bVar39 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar46._0_4_
      ;
      bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar43 * auVar47._4_4_ | (uint)!bVar43 * auVar46._4_4_;
      bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar43 * auVar47._8_4_ | (uint)!bVar43 * auVar46._8_4_;
      bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar43 * auVar47._12_4_ | (uint)!bVar43 * auVar46._12_4_;
      bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
      auVar51._16_4_ = (uint)bVar43 * auVar47._16_4_ | (uint)!bVar43 * auVar46._16_4_;
      bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
      auVar51._20_4_ = (uint)bVar43 * auVar47._20_4_ | (uint)!bVar43 * auVar46._20_4_;
      bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
      auVar51._24_4_ = (uint)bVar43 * auVar47._24_4_ | (uint)!bVar43 * auVar46._24_4_;
      bVar43 = SUB81(uVar44 >> 7,0);
      auVar51._28_4_ = (uint)bVar43 * auVar47._28_4_ | (uint)!bVar43 * auVar46._28_4_;
      auVar46 = vpermt2q_avx512vl(auVar48,auVar51,auVar15);
      sVar42 = auVar46._0_8_;
      bVar39 = bVar39 - 1 & bVar39;
      if (bVar39 != 0) goto LAB_01c7c18c;
    }
    if ((sVar42 & 8) == 0) {
      uVar37 = sVar42 & 0xfffffffffffffff0;
      fVar5 = query->time;
      auVar47._4_4_ = fVar5;
      auVar47._0_4_ = fVar5;
      auVar47._8_4_ = fVar5;
      auVar47._12_4_ = fVar5;
      auVar47._16_4_ = fVar5;
      auVar47._20_4_ = fVar5;
      auVar47._24_4_ = fVar5;
      auVar47._28_4_ = fVar5;
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100),auVar47,
                                *(undefined1 (*) [32])(uVar37 + 0x40));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x140),auVar47,
                                *(undefined1 (*) [32])(uVar37 + 0x80));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x180),auVar47,
                                *(undefined1 (*) [32])(uVar37 + 0xc0));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x120),auVar47,
                                *(undefined1 (*) [32])(uVar37 + 0x60));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x160),auVar47,
                                *(undefined1 (*) [32])(uVar37 + 0xa0));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x1a0),auVar47,
                                *(undefined1 (*) [32])(uVar37 + 0xe0));
      auVar48 = vmaxps_avx(auVar56,ZEXT1632(auVar27));
      auVar48 = vminps_avx(auVar48,ZEXT1632(auVar30));
      auVar15 = vsubps_avx(auVar48,auVar56);
      auVar48 = vmaxps_avx(auVar57,ZEXT1632(auVar28));
      auVar48 = vminps_avx(auVar48,ZEXT1632(auVar31));
      auVar46 = vsubps_avx(auVar48,auVar57);
      auVar48 = vmaxps_avx(auVar60,ZEXT1632(auVar29));
      auVar48 = vminps_avx(auVar48,ZEXT1632(auVar32));
      auVar48 = vsubps_avx(auVar48,auVar60);
      auVar53._0_4_ =
           auVar15._0_4_ * auVar15._0_4_ + auVar46._0_4_ * auVar46._0_4_ +
           auVar48._0_4_ * auVar48._0_4_;
      auVar53._4_4_ =
           auVar15._4_4_ * auVar15._4_4_ + auVar46._4_4_ * auVar46._4_4_ +
           auVar48._4_4_ * auVar48._4_4_;
      auVar53._8_4_ =
           auVar15._8_4_ * auVar15._8_4_ + auVar46._8_4_ * auVar46._8_4_ +
           auVar48._8_4_ * auVar48._8_4_;
      auVar53._12_4_ =
           auVar15._12_4_ * auVar15._12_4_ + auVar46._12_4_ * auVar46._12_4_ +
           auVar48._12_4_ * auVar48._12_4_;
      auVar53._16_4_ =
           auVar15._16_4_ * auVar15._16_4_ + auVar46._16_4_ * auVar46._16_4_ +
           auVar48._16_4_ * auVar48._16_4_;
      auVar53._20_4_ =
           auVar15._20_4_ * auVar15._20_4_ + auVar46._20_4_ * auVar46._20_4_ +
           auVar48._20_4_ * auVar48._20_4_;
      auVar53._24_4_ =
           auVar15._24_4_ * auVar15._24_4_ + auVar46._24_4_ * auVar46._24_4_ +
           auVar48._24_4_ * auVar48._24_4_;
      auVar53._28_4_ = auVar46._28_4_ + 0.0 + auVar48._28_4_;
      uVar44 = vcmpps_avx512vl(auVar53,auVar45,2);
      uVar38 = vcmpps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar30),2);
      uVar44 = uVar44 & uVar38;
      if ((uVar41 & 7) == 6) {
        uVar25 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(uVar37 + 0x1c0),0xd);
        uVar24 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
        uVar44 = (ulong)(byte)((byte)uVar25 & (byte)uVar24 & (byte)uVar44);
      }
      goto LAB_01c7bfce;
    }
LAB_01c7c3fb:
    bVar39 = 0;
    for (lVar35 = 0; (ulong)(uVar41 & 0xf) - 8 != lVar35; lVar35 = lVar35 + 1) {
      uVar7 = *(uint *)((sVar42 & 0xfffffffffffffff0) + lVar35 * 8);
      this = (context->scene->geometries).items[uVar7].ptr;
      context->geomID = uVar7;
      context->primID = *(uint *)((sVar42 & 0xfffffffffffffff0) + 4 + lVar35 * 8);
      bVar43 = Geometry::pointQuery(this,query,context);
      bVar39 = bVar39 | bVar43;
    }
    auVar59 = ZEXT1664(auVar58);
    auVar48 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar61 = ZEXT3264(auVar48);
    auVar62 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    if (bVar39 == 0) goto LAB_01c7bed3;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar52._4_4_ = uVar4;
    auVar52._0_4_ = uVar4;
    auVar52._8_4_ = uVar4;
    auVar52._12_4_ = uVar4;
    auVar52._16_4_ = uVar4;
    auVar52._20_4_ = uVar4;
    auVar52._24_4_ = uVar4;
    auVar52._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar54._4_4_ = uVar4;
    auVar54._0_4_ = uVar4;
    auVar54._8_4_ = uVar4;
    auVar54._12_4_ = uVar4;
    auVar54._16_4_ = uVar4;
    auVar54._20_4_ = uVar4;
    auVar54._24_4_ = uVar4;
    auVar54._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar45._4_4_ = uVar4;
    auVar45._0_4_ = uVar4;
    auVar45._8_4_ = uVar4;
    auVar45._12_4_ = uVar4;
    auVar45._16_4_ = uVar4;
    auVar45._20_4_ = uVar4;
    auVar45._24_4_ = uVar4;
    auVar45._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar59 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      auVar58 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar59 = ZEXT1664(auVar58);
    }
    bVar34 = true;
  } while( true );
LAB_01c7c18c:
  auVar46 = vpshufd_avx2(auVar51,0x55);
  vpermt2q_avx512vl(auVar48,auVar46,auVar15);
  auVar47 = vpminsd_avx2(auVar51,auVar46);
  auVar46 = vpmaxsd_avx2(auVar51,auVar46);
  bVar39 = bVar39 - 1 & bVar39;
  if (bVar39 == 0) {
    auVar47 = vpermi2q_avx512vl(auVar47,auVar48,auVar15);
    sVar42 = auVar47._0_8_;
    auVar48 = vpermt2q_avx512vl(auVar48,auVar46,auVar15);
    (pSVar40->ptr).ptr = auVar48._0_8_;
    lVar35 = 8;
    lStack_24e0 = 0x10;
  }
  else {
    auVar18 = vpshufd_avx2(auVar51,0xaa);
    vpermt2q_avx512vl(auVar48,auVar18,auVar15);
    auVar49 = vpminsd_avx2(auVar47,auVar18);
    auVar47 = vpmaxsd_avx2(auVar47,auVar18);
    auVar18 = vpminsd_avx2(auVar46,auVar47);
    auVar47 = vpmaxsd_avx2(auVar46,auVar47);
    bVar39 = bVar39 - 1 & bVar39;
    if (bVar39 == 0) {
      auVar46 = vpermi2q_avx512vl(auVar49,auVar48,auVar15);
      sVar42 = auVar46._0_8_;
      auVar46 = vpermt2q_avx512vl(auVar48,auVar47,auVar15);
      (pSVar40->ptr).ptr = auVar46._0_8_;
      auVar46 = vpermd_avx2(auVar47,auVar53);
      pSVar40->dist = auVar46._0_4_;
      auVar48 = vpermt2q_avx512vl(auVar48,auVar18,auVar15);
      pSVar40[1].ptr.ptr = auVar48._0_8_;
      lStack_24e0 = 0x18;
      lVar35 = lStack_24e0;
      lStack_24e0 = 0x20;
      auVar46 = auVar18;
    }
    else {
      auVar46 = vpshufd_avx2(auVar51,0xff);
      vpermt2q_avx512vl(auVar48,auVar46,auVar15);
      auVar16 = vpminsd_avx2(auVar49,auVar46);
      auVar49 = vpmaxsd_avx2(auVar49,auVar46);
      auVar46 = vpminsd_avx2(auVar18,auVar49);
      auVar49 = vpmaxsd_avx2(auVar18,auVar49);
      auVar18 = vpminsd_avx2(auVar47,auVar49);
      auVar47 = vpmaxsd_avx2(auVar47,auVar49);
      bVar39 = bVar39 - 1 & bVar39;
      if (bVar39 != 0) {
        auVar50 = valignd_avx512vl(auVar51,auVar51,3);
        auVar49 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar51 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar49,auVar16);
        auVar49 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar46 = vpermt2d_avx512vl(auVar51,auVar49,auVar46);
        auVar49 = vpermt2d_avx512vl(auVar46,auVar49,auVar18);
        auVar46 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar46 = vpermt2d_avx512vl(auVar49,auVar46,auVar47);
        auVar59 = ZEXT3264(auVar46);
        bVar36 = bVar39;
        do {
          auVar47 = auVar59._0_32_;
          auVar46._8_4_ = 1;
          auVar46._0_8_ = 0x100000001;
          auVar46._12_4_ = 1;
          auVar46._16_4_ = 1;
          auVar46._20_4_ = 1;
          auVar46._24_4_ = 1;
          auVar46._28_4_ = 1;
          auVar46 = vpermd_avx2(auVar46,auVar50);
          auVar50 = valignd_avx512vl(auVar50,auVar50,1);
          vpermt2q_avx512vl(auVar48,auVar50,auVar15);
          bVar36 = bVar36 - 1 & bVar36;
          uVar25 = vpcmpd_avx512vl(auVar46,auVar47,5);
          auVar46 = vpmaxsd_avx2(auVar46,auVar47);
          bVar26 = (byte)uVar25 << 1;
          auVar47 = valignd_avx512vl(auVar47,auVar47,7);
          bVar43 = (bool)((byte)uVar25 & 1);
          bVar8 = (bool)(bVar26 >> 2 & 1);
          bVar9 = (bool)(bVar26 >> 3 & 1);
          bVar10 = (bool)(bVar26 >> 4 & 1);
          bVar11 = (bool)(bVar26 >> 5 & 1);
          bVar12 = (bool)(bVar26 >> 6 & 1);
          auVar59 = ZEXT3264(CONCAT428((uint)(bVar26 >> 7) * auVar47._28_4_ |
                                       (uint)!(bool)(bVar26 >> 7) * auVar46._28_4_,
                                       CONCAT424((uint)bVar12 * auVar47._24_4_ |
                                                 (uint)!bVar12 * auVar46._24_4_,
                                                 CONCAT420((uint)bVar11 * auVar47._20_4_ |
                                                           (uint)!bVar11 * auVar46._20_4_,
                                                           CONCAT416((uint)bVar10 * auVar47._16_4_ |
                                                                     (uint)!bVar10 * auVar46._16_4_,
                                                                     CONCAT412((uint)bVar9 *
                                                                               auVar47._12_4_ |
                                                                               (uint)!bVar9 *
                                                                               auVar46._12_4_,
                                                                               CONCAT48((uint)bVar8
                                                                                        * auVar47.
                                                  _8_4_ | (uint)!bVar8 * auVar46._8_4_,
                                                  CONCAT44((uint)bVar43 * auVar47._4_4_ |
                                                           (uint)!bVar43 * auVar46._4_4_,
                                                           auVar46._0_4_))))))));
        } while (bVar36 != 0);
        lVar35 = (ulong)(uint)POPCOUNT((uint)bVar39) + 3;
        while( true ) {
          auVar47 = auVar59._0_32_;
          auVar46 = vpermt2q_avx512vl(auVar48,auVar47,auVar15);
          sVar42 = auVar46._0_8_;
          bVar43 = lVar35 == 0;
          lVar35 = lVar35 + -1;
          if (bVar43) break;
          (pSVar40->ptr).ptr = sVar42;
          auVar46 = vpermd_avx2(auVar47,auVar53);
          pSVar40->dist = auVar46._0_4_;
          auVar46 = valignd_avx512vl(auVar47,auVar47,1);
          auVar59 = ZEXT3264(auVar46);
          pSVar40 = pSVar40 + 1;
        }
        auVar59 = ZEXT1664(auVar58);
        goto LAB_01c7beef;
      }
      auVar49 = vpermi2q_avx512vl(auVar16,auVar48,auVar15);
      sVar42 = auVar49._0_8_;
      auVar49 = vpermt2q_avx512vl(auVar48,auVar47,auVar15);
      (pSVar40->ptr).ptr = auVar49._0_8_;
      auVar47 = vpermd_avx2(auVar47,auVar53);
      pSVar40->dist = auVar47._0_4_;
      auVar47 = vpermt2q_avx512vl(auVar48,auVar18,auVar15);
      pSVar40[1].ptr.ptr = auVar47._0_8_;
      auVar47 = vpermd_avx2(auVar18,auVar53);
      pSVar40[1].dist = auVar47._0_4_;
      auVar48 = vpermt2q_avx512vl(auVar48,auVar46,auVar15);
      pSVar40[2].ptr.ptr = auVar48._0_8_;
      lVar35 = 0x28;
      lStack_24e0 = 0x30;
    }
  }
  auVar48 = vpermd_avx2(auVar46,auVar53);
  *(int *)((long)&(pSVar40->ptr).ptr + lVar35) = auVar48._0_4_;
  pSVar40 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar40->ptr).ptr + lStack_24e0);
  goto LAB_01c7beef;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }